

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdlib.cpp
# Opt level: O0

FString NicePath(char *path)

{
  __uid_t __uid;
  size_t sVar1;
  char *__name;
  char *in_RSI;
  FString local_48;
  undefined1 local_3d;
  FString local_30;
  FString who;
  char *slash;
  passwd *pwstruct;
  char *path_local;
  FString *where;
  
  if ((in_RSI == (char *)0x0) || (*in_RSI == '\0')) {
    FString::FString((FString *)path,"");
  }
  else if (*in_RSI == '~') {
    if ((in_RSI[1] == '/') || (in_RSI[1] == '\0')) {
      __uid = getuid();
      slash = (char *)getpwuid(__uid);
      who.Chars = in_RSI + 1;
    }
    else {
      who.Chars = strchr(in_RSI,0x2f);
      if (who.Chars == (char *)0x0) {
        sVar1 = strlen(in_RSI);
        who.Chars = in_RSI + sVar1;
      }
      FString::FString(&local_30,in_RSI,(long)who.Chars - (long)in_RSI);
      __name = FString::operator_cast_to_char_(&local_30);
      slash = (char *)getpwnam(__name);
      FString::~FString(&local_30);
    }
    if (slash == (char *)0x0) {
      ExpandEnvVars(path);
    }
    else {
      local_3d = 0;
      FString::FString((FString *)path,*(char **)(slash + 0x20));
      if (*who.Chars != '\0') {
        ExpandEnvVars((char *)&local_48);
        FString::operator+=((FString *)path,&local_48);
        FString::~FString(&local_48);
      }
    }
  }
  else {
    ExpandEnvVars(path);
  }
  return (FString)path;
}

Assistant:

FString NicePath(const char *path)
{
#ifdef _WIN32
	return ExpandEnvVars(path);
#else
	if (path == NULL || *path == '\0')
	{
		return FString("");
	}
	if (*path != '~')
	{
		return ExpandEnvVars(path);
	}

	passwd *pwstruct;
	const char *slash;

	if (path[1] == '/' || path[1] == '\0')
	{ // Get my home directory
		pwstruct = getpwuid(getuid());
		slash = path + 1;
	}
	else
	{ // Get somebody else's home directory
		slash = strchr(path, '/');
		if (slash == NULL)
		{
			slash = path + strlen(path);
		}
		FString who(path, slash - path);
		pwstruct = getpwnam(who);
	}
	if (pwstruct == NULL)
	{
		return ExpandEnvVars(path);
	}
	FString where(pwstruct->pw_dir);
	if (*slash != '\0')
	{
		where += ExpandEnvVars(slash);
	}
	return where;
#endif
}